

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O1

void __thiscall
embree::Points::convertToDeviceRepresentation
          (Points *this,size_t offset,char *data_host,char *data_device)

{
  char *__dest;
  undefined8 *puVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  __dest = data_host + offset;
  memcpy(__dest,this,0x130);
  lVar11 = offset + 0x130;
  lVar9 = lVar11;
  if ((this->vertices).size_active != 0) {
    if ((this->super_Geometry).numTimeSteps != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pBVar2 = (this->vertices).items;
        *(undefined8 *)(data_host + lVar9 + offset + 0x160) =
             *(undefined8 *)((long)&(pBVar2->super_RawBufferView).buffer.ptr + lVar9);
        puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar9);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).stride + lVar9);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).format + lVar9);
        uVar8 = puVar1[1];
        *(undefined8 *)(data_host + lVar9 + offset + 0x150) = *puVar1;
        *(undefined8 *)(data_host + lVar9 + offset + 0x150 + 8) = uVar8;
        *(undefined8 *)(data_host + lVar9 + offset + 0x140) = uVar6;
        *(undefined8 *)(data_host + lVar9 + offset + 0x140 + 8) = uVar7;
        *(undefined8 *)(data_host + lVar9 + lVar11) = uVar4;
        *(undefined8 *)(data_host + lVar9 + lVar11 + 8) = uVar5;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x38;
      } while (uVar10 < (this->super_Geometry).numTimeSteps);
      lVar9 = lVar9 + lVar11;
    }
    *(char **)(__dest + 0xe0) = data_device + lVar11;
  }
  if ((this->normals).size_active != 0) {
    if ((this->super_Geometry).numTimeSteps != 0) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        pBVar3 = (this->normals).items;
        *(undefined8 *)(data_host + lVar11 + lVar9 + 0x30) =
             *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar11);
        puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar11);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).stride + lVar11);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).format + lVar11);
        uVar8 = puVar1[1];
        *(undefined8 *)(data_host + lVar11 + lVar9 + 0x20) = *puVar1;
        *(undefined8 *)(data_host + lVar11 + lVar9 + 0x20 + 8) = uVar8;
        *(undefined8 *)(data_host + lVar11 + lVar9 + 0x10) = uVar6;
        *(undefined8 *)(data_host + lVar11 + lVar9 + 0x10 + 8) = uVar7;
        *(undefined8 *)(data_host + lVar11 + lVar9) = uVar4;
        *(undefined8 *)(data_host + lVar11 + lVar9 + 8) = uVar5;
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x38;
      } while (uVar10 < (this->super_Geometry).numTimeSteps);
    }
    *(char **)(__dest + 0x100) = data_device + lVar9;
  }
  return;
}

Assistant:

void Points::convertToDeviceRepresentation(size_t offset, char* data_host, char* data_device) const {
    Points* points = (Points*)(data_host + offset);
    std::memcpy(data_host + offset, (void*)this, sizeof(Points));
    offset += sizeof(Points);
    if (vertices.size() > 0) {
      const size_t offsetVertices = offset;
      for (size_t t = 0; t < numTimeSteps; ++t) {
        std::memcpy(data_host + offset, &(vertices[t]), sizeof(BufferView<Vec3ff>));
        offset += sizeof(BufferView<Vec3ff>);
      }
      points->vertices.setDataPtr((BufferView<Vec3ff>*)(data_device + offsetVertices));
    }
    if (normals.size() > 0) {
      const size_t offsetNormals = offset;
      for (size_t t = 0; t < numTimeSteps; ++t) {
        std::memcpy(data_host + offset, &(normals[t]), sizeof(BufferView<Vec3fa>));
        offset += sizeof(BufferView<Vec3fa>);
      }
      points->normals.setDataPtr((BufferView<Vec3fa>*)(data_device + offsetNormals));
    }
  }